

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

size_t mpz_out_str(FILE *stream,int base,__mpz_struct *x)

{
  char *__s;
  size_t __n;
  size_t sVar1;
  
  __s = mpz_get_str((char *)0x0,base,x);
  if (__s == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    __n = strlen(__s);
    sVar1 = fwrite(__s,1,__n,(FILE *)stream);
    (*gmp_free_func)(__s,__n + 1);
  }
  return sVar1;
}

Assistant:

size_t
mpz_out_str (FILE *stream, int base, const mpz_t x)
{
  char *str;
  size_t len, n;

  str = mpz_get_str (NULL, base, x);
  if (!str)
    return 0;
  len = strlen (str);
  n = fwrite (str, 1, len, stream);
  gmp_free (str, len + 1);
  return n;
}